

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

size_t FourCCToString(tchar_t *Out,size_t OutLen,fourcc_t FourCC)

{
  size_t sVar1;
  size_t sVar2;
  anon_union_4_2_94730004 s;
  
  if (OutLen == 0) {
    return 0;
  }
  sVar1 = 4;
  if (OutLen - 1 < 4) {
    sVar1 = OutLen - 1;
  }
  s.d = FourCC;
  for (sVar2 = 0; sVar2 != sVar1; sVar2 = sVar2 + 1) {
    Out[sVar2] = s.a[sVar2];
  }
  do {
    sVar2 = sVar1;
    if (sVar2 == 0) {
      sVar2 = 0;
      break;
    }
    sVar1 = sVar2 - 1;
  } while (Out[sVar2 - 1] == '_');
  Out[sVar2] = '\0';
  return sVar2;
}

Assistant:

size_t FourCCToString(tchar_t* Out, size_t OutLen, fourcc_t FourCC)
{
    size_t i=0;
    if (OutLen)
    {
	    union
	    {
		    fourcc_t d;
		    uint8_t a[4];
	    } s;

	    s.d = FourCC;
	    for (i=0;i<4 && i<OutLen-1;++i)
            Out[i] = s.a[i];

        while (i>0 && Out[i-1]=='_')
            --i;

        Out[i] = 0;
    }
    return i;
}